

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int store_config_flag(lys_node *node,int options)

{
  uint uVar1;
  ushort uVar2;
  
  uVar1 = node->nodetype - LYS_CONTAINER;
  if ((((uVar1 < 0x40) &&
       (((0x8000808bUL >> ((ulong)uVar1 & 0x3f) & 1) != 0 || ((ulong)uVar1 == 0x3f)))) ||
      (node->nodetype == LYS_ANYDATA)) &&
     (((options & 3U) == 0 && (uVar2 = node->flags, (uVar2 & 3) == 0)))) {
    if (node->parent == (lys_node *)0x0) {
      uVar2 = uVar2 | 1;
    }
    else {
      uVar2 = uVar2 | node->parent->flags & 3;
    }
    node->flags = uVar2;
  }
  return 0;
}

Assistant:

int
store_config_flag(struct lys_node *node, int options)
{
    switch (node->nodetype) {
    case LYS_CONTAINER:
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_LIST:
    case LYS_CHOICE:
    case LYS_ANYDATA:
    case LYS_ANYXML:
        if (options & LYS_PARSE_OPT_CFG_IGNORE) {
            node->flags |= node->flags & (~(LYS_CONFIG_MASK | LYS_CONFIG_SET));
        } else if (!(options & LYS_PARSE_OPT_CFG_NOINHERIT)) {
            if (!(node->flags & LYS_CONFIG_MASK)) {
                /* get config flag from parent */
                if (node->parent) {
                    node->flags |= node->parent->flags & LYS_CONFIG_MASK;
                } else {
                    /* default config is true */
                    node->flags |= LYS_CONFIG_W;
                }
            }
        }
        break;
    case LYS_CASE:
        if (!(options & (LYS_PARSE_OPT_CFG_IGNORE | LYS_PARSE_OPT_CFG_NOINHERIT))) {
            if (!(node->flags & LYS_CONFIG_MASK)) {
                /* get config flag from parent */
                if (node->parent) {
                    node->flags |= node->parent->flags & LYS_CONFIG_MASK;
                } else {
                    /* default config is true */
                    node->flags |= LYS_CONFIG_W;
                }
            }
        }
        break;
    default:
        break;
    }

    return EXIT_SUCCESS;
}